

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_keytype.cpp
# Opt level: O1

char * ulocimp_toLegacyKey_63(char *key)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = init((EVP_PKEY_CTX *)key);
  if (((char)iVar1 != '\0') &&
     (puVar2 = (undefined8 *)uhash_get_63(gLocExtKeyMap,key), puVar2 != (undefined8 *)0x0)) {
    return (char *)*puVar2;
  }
  return (char *)0x0;
}

Assistant:

U_CFUNC const char*
ulocimp_toLegacyKey(const char* key) {
    if (!init()) {
        return NULL;
    }

    LocExtKeyData* keyData = (LocExtKeyData*)uhash_get(gLocExtKeyMap, key);
    if (keyData != NULL) {
        return keyData->legacyId;
    }
    return NULL;
}